

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoAssignOneClass3(Gia_IsoMan_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  word *pwVar7;
  undefined8 in_RAX;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  pVVar5 = p->vClasses;
  iVar3 = pVVar5->nSize;
  if ((long)iVar3 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x22e,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  if (iVar3 == 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  lVar9 = (long)pVVar5->pArray[iVar3 - 2U];
  uVar4 = pVVar5->pArray[(long)iVar3 + -1];
  pVVar5->nSize = iVar3 - 2U;
  if ((int)uVar4 < 2) {
    __assert_fail("nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x234,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  piVar6 = p->pUniques;
  pwVar7 = p->pStoreW;
  uVar8 = pwVar7[lVar9] >> 0x20;
  if (uVar4 == 2) {
    if (piVar6[uVar8] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x237,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar3 = p->nUniques;
    p->nUniques = iVar3 + 1;
    piVar6[uVar8] = iVar3;
    uVar1 = p->nSingles;
    uVar2 = p->nEntries;
    p->nSingles = uVar1 + 1;
    p->nEntries = uVar2 + -1;
    uVar10 = pwVar7[lVar9 + 1] >> 0x20;
    if (piVar6[uVar10] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x23c,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar3 = p->nUniques;
    p->nUniques = iVar3 + 1;
    piVar6[uVar10] = iVar3;
  }
  else {
    if (piVar6[uVar8] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x243,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar3 = p->nUniques;
    p->nUniques = iVar3 + 1;
    piVar6[uVar8] = iVar3;
  }
  p->nSingles = p->nSingles + 1;
  p->nEntries = p->nEntries + -1;
  printf("Broke ties in last class of size %d at level %d.\n",(ulong)uVar4,
         (ulong)(uint)p->pLevels[uVar8],in_RAX);
  return;
}

Assistant:

void Gia_IsoAssignOneClass3( Gia_IsoMan_t * p )
{
    int iBegin, nSize;
    // find the last class
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    nSize  = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 1 );
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    // assign the class
    assert( nSize > 1 );
    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    printf( "Broke ties in last class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}